

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlRuleTable::DebugEngineCode
          (GdlRuleTable *this,GrcManager *pcman,uint32_t fxdRuleVersion,ostream *strmOut)

{
  ostream *poVar1;
  size_type_conflict sVar2;
  ostream *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  GrcManager *in_RDI;
  GdlPass *unaff_retaddr;
  size_t ippass;
  ulong local_58;
  string local_40 [8];
  GrcSymbolTableEntry *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  GrcManager *pcman_00;
  
  pcman_00 = in_RDI;
  poVar1 = std::operator<<(in_RCX,"\nTABLE: ");
  GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_ffffffffffffffc8);
  poVar1 = std::operator<<(poVar1,local_40);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_40);
  local_58 = 0;
  while( true ) {
    sVar2 = std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::size
                      ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)
                       &(in_RDI->m_mpnfCompressionInfo)._M_t._M_impl.super__Rb_tree_header._M_header
                        ._M_left);
    if (sVar2 <= local_58) break;
    std::vector<GdlPass_*,_std::allocator<GdlPass_*>_>::operator[]
              ((vector<GdlPass_*,_std::allocator<GdlPass_*>_> *)
               &(in_RDI->m_mpnfCompressionInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
               ,local_58);
    GdlPass::DebugEngineCode
              (unaff_retaddr,pcman_00,(uint32_t)((ulong)in_RSI >> 0x20),
               (ostream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

void GdlRuleTable::DebugEngineCode(GrcManager * pcman, uint32_t fxdRuleVersion, std::ostream & strmOut)
{
	strmOut << "\nTABLE: " << m_psymName->FullName() << "\n";
	for (size_t ippass = 0; ippass < m_vppass.size(); ippass++)
	{
		m_vppass[ippass]->DebugEngineCode(pcman, fxdRuleVersion, strmOut);
	}
}